

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O1

void __thiscall llbuild::basic::StringList::StringList(StringList *this,StringRef value)

{
  char *__dest;
  void *pvVar1;
  long lVar2;
  size_t __n;
  char *__s;
  
  __n = value.Length;
  __s = value.Data;
  this->contents = (char *)0x0;
  this->size = __n + 1;
  __dest = (char *)operator_new__(__n + 1);
  this->contents = __dest;
  if (__n != 0) {
    pvVar1 = memchr(__s,0,__n);
    if (pvVar1 != (void *)0x0) {
      lVar2 = (long)pvVar1 - (long)__s;
      goto LAB_001b6870;
    }
  }
  lVar2 = -1;
LAB_001b6870:
  if (lVar2 == -1) {
    memcpy(__dest,__s,__n);
    __dest[__n] = '\0';
    return;
  }
  __assert_fail("value.find(\'\\0\') == StringRef::npos",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                ,0x31,"llbuild::basic::StringList::StringList(StringRef)");
}

Assistant:

explicit StringList(StringRef value) {
    size = value.size() + 1;
    contents = new char[size];
    assert(value.find('\0') == StringRef::npos);
    memcpy(contents, value.data(), value.size());
    contents[size - 1] = '\0';
  }